

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.h
# Opt level: O1

NBestEncodeResult * __thiscall
sentencepiece::ModelInterface::SampleEncodeAndScore
          (NBestEncodeResult *__return_storage_ptr__,ModelInterface *this,string_view normalized,
          float alpha,int samples,bool wor,bool include_best)

{
  int iVar1;
  ostream *poVar2;
  initializer_list<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
  __l;
  allocator_type local_39;
  pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
  local_38;
  
  iVar1 = logging::GetMinLogLevel();
  if (iVar1 < 3) {
    local_38.first.
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_38.first.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"model_interface.h",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"LOG(",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ERROR",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Not implemented.",0x10);
    error::Die::~Die((Die *)&local_38);
  }
  local_38.first.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_38.first.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_38.second = 0.0;
  local_38.first.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.first.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_38.first.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  __l._M_len = 1;
  __l._M_array = &local_38;
  std::
  vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  ::vector(__return_storage_ptr__,__l,&local_39);
  if (local_38.first.
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.first.
                    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(local_38.first.
                             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_38.first.
                             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_38.first.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual NBestEncodeResult SampleEncodeAndScore(absl::string_view normalized,
                                                 float alpha, int samples,
                                                 bool wor,
                                                 bool include_best) const {
    LOG(ERROR) << "Not implemented.";
    return {{EncodeResult(), 0.0}};
  }